

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O1

char * blogc_get_filename(char *f)

{
  bool bVar1;
  char *__s;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  char *pcVar8;
  
  if ((f == (char *)0x0) || (*f == '\0')) {
    return (char *)0x0;
  }
  __s = bc_strdup(f);
  sVar2 = strlen(__s);
  pcVar6 = __s;
  if (-1 < (int)(uint)sVar2) {
    uVar3 = (ulong)((uint)sVar2 & 0x7fffffff);
    pcVar8 = __s + uVar3 + 1;
    bVar7 = false;
    lVar4 = uVar3 + 1;
    do {
      if ((bVar7) || (pcVar8[-1] != '.')) {
        pcVar6 = pcVar8;
        if ((pcVar8[-1] == '\\') || (pcVar8[-1] == '/')) break;
      }
      else {
        pcVar8[-1] = '\0';
        bVar7 = true;
      }
      pcVar8 = pcVar8 + -1;
      lVar5 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      lVar4 = lVar5;
      pcVar6 = __s;
    } while (lVar5 != 0 && bVar1);
  }
  pcVar6 = bc_strdup(pcVar6);
  free(__s);
  return pcVar6;
}

Assistant:

char*
blogc_get_filename(const char *f)
{
    if (f == NULL)
        return NULL;

    if (strlen(f) == 0)
        return NULL;

    char *filename = bc_strdup(f);

    // keep a pointer to original string
    char *tmp = filename;

    bool removed_dot = false;
    for (int i = strlen(tmp); i >= 0 ; i--) {

        // remove last extension
        if (!removed_dot && tmp[i] == '.') {
            tmp[i] = '\0';
            removed_dot = true;
            continue;
        }

        if (tmp[i] == '/' || tmp[i] == '\\') {
            tmp += i + 1;
            break;
        }
    }

    char *final_filename = bc_strdup(tmp);
    free(filename);

    return final_filename;
}